

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_stream.c
# Opt level: O0

_Bool al_set_audio_stream_playmode(ALLEGRO_AUDIO_STREAM *stream,ALLEGRO_PLAYMODE val)

{
  ALLEGRO_PLAYMODE val_local;
  ALLEGRO_AUDIO_STREAM *stream_local;
  _Bool local_1;
  
  if (val == ALLEGRO_PLAYMODE_ONCE) {
    (stream->spl).loop = _ALLEGRO_PLAYMODE_STREAM_ONCE;
    local_1 = true;
  }
  else if (val == ALLEGRO_PLAYMODE_LOOP) {
    if (stream->feeder == (stream_callback_t)0x0) {
      local_1 = false;
    }
    else {
      (stream->spl).loop = _ALLEGRO_PLAYMODE_STREAM_ONEDIR;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool al_set_audio_stream_playmode(ALLEGRO_AUDIO_STREAM *stream,
   ALLEGRO_PLAYMODE val)
{
   ASSERT(stream);

   if (val == ALLEGRO_PLAYMODE_ONCE) {
      stream->spl.loop = _ALLEGRO_PLAYMODE_STREAM_ONCE;
      return true;
   }
   else if (val == ALLEGRO_PLAYMODE_LOOP) {
      /* Only streams creating by al_load_audio_stream() support
       * looping. */
      if (!stream->feeder)
         return false;

      stream->spl.loop = _ALLEGRO_PLAYMODE_STREAM_ONEDIR;
      return true;
   }

   // XXX _al_set_error
   return false;
}